

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HDualMulti.cpp
# Opt level: O3

void __thiscall HDual::major_rollback(HDual *this)

{
  int columnIn;
  pointer piVar1;
  pointer pdVar2;
  bool bVar3;
  pointer piVar4;
  ulong uVar5;
  HModel *this_00;
  ulong uVar6;
  long lVar7;
  
  if (0 < (long)this->multi_nFinish) {
    this_00 = this->model;
    lVar7 = (long)this->multi_nFinish;
    do {
      piVar4 = (this_00->nonbasicMove).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar4[this->multi_finish[lVar7 + -1].columnIn] = this->multi_finish[lVar7 + -1].moveIn;
      piVar1 = (this_00->nonbasicFlag).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar1[this->multi_finish[lVar7 + -1].columnIn] = 1;
      piVar4[this->multi_finish[lVar7 + -1].columnOut] = 0;
      piVar1[this->multi_finish[lVar7 + -1].columnOut] = 0;
      columnIn = this->multi_finish[lVar7 + -1].columnOut;
      (this_00->basicIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start[this->multi_finish[lVar7 + -1].rowOut] = columnIn;
      HModel::updateMatrix(this_00,columnIn,this->multi_finish[lVar7 + -1].columnIn);
      piVar4 = this->multi_finish[lVar7 + -1].flipList.super__Vector_base<int,_std::allocator<int>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (this->multi_finish[lVar7 + -1].flipList.super__Vector_base<int,_std::allocator<int>_>.
          _M_impl.super__Vector_impl_data._M_finish != piVar4) {
        uVar5 = 0;
        uVar6 = 1;
        do {
          HModel::flipBound(this->model,piVar4[uVar5]);
          piVar4 = this->multi_finish[lVar7 + -1].flipList.
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start;
          bVar3 = uVar6 < (ulong)((long)this->multi_finish[lVar7 + -1].flipList.
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_finish - (long)piVar4 >> 2);
          uVar5 = uVar6;
          uVar6 = (ulong)((int)uVar6 + 1);
        } while (bVar3);
      }
      this_00 = this->model;
      pdVar2 = (this_00->workShift).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar2[this->multi_finish[lVar7 + -1].columnIn] = 0.0;
      pdVar2[this->multi_finish[lVar7 + -1].columnOut] = this->multi_finish[lVar7 + -1].shiftOut;
      this_00->numberIteration = this_00->numberIteration + -1;
      bVar3 = 1 < lVar7;
      lVar7 = lVar7 + -1;
    } while (bVar3);
  }
  return;
}

Assistant:

void HDual::major_rollback() {
    for (int iFn = multi_nFinish - 1; iFn >= 0; iFn--) {
        MFinish *Fin = &multi_finish[iFn];

        // 1. Roll back pivot
        model->getNonbasicMove()[Fin->columnIn] = Fin->moveIn;
        model->getNonbasicFlag()[Fin->columnIn] = 1;
        model->getNonbasicMove()[Fin->columnOut] = 0;
        model->getNonbasicFlag()[Fin->columnOut] = 0;
        model->getBaseIndex()[Fin->rowOut] = Fin->columnOut;

        // 2. Roll back matrix
        model->updateMatrix(Fin->columnOut, Fin->columnIn);

        // 3. Roll back flips
        for (unsigned i = 0; i < Fin->flipList.size(); i++)
            model->flipBound(Fin->flipList[i]);

        // 4. Roll back cost
        model->getWorkShift()[Fin->columnIn] = 0;
        model->getWorkShift()[Fin->columnOut] = Fin->shiftOut;

        // 5. The iteration count
        model->numberIteration--;
    }
}